

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_hasUnlinkedUnitsWhenBaseUnitsAddedToVariableByName_Test::
~Units_hasUnlinkedUnitsWhenBaseUnitsAddedToVariableByName_Test
          (Units_hasUnlinkedUnitsWhenBaseUnitsAddedToVariableByName_Test *this)

{
  Units_hasUnlinkedUnitsWhenBaseUnitsAddedToVariableByName_Test *this_local;
  
  ~Units_hasUnlinkedUnitsWhenBaseUnitsAddedToVariableByName_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, hasUnlinkedUnitsWhenBaseUnitsAddedToVariableByName)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();

    libcellml::UnitsPtr u1 = libcellml::Units::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();

    u1->setName("a_unit");

    c1->addVariable(v1);
    m->addComponent(c1);

    m->addUnits(u1);
    v1->setUnits("a_unit");

    EXPECT_TRUE(m->hasUnlinkedUnits());
}